

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::NotILikeOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t i;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  string_t str;
  string_t str_00;
  string_t str_01;
  string_t pattern;
  string_t pattern_00;
  string_t pattern_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar6 = 8;
    for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
      str_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar6);
      str_01.value._0_8_ = *(undefined8 *)((long)ldata + lVar6 + -8);
      pattern_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + lVar6);
      pattern_01.value._0_8_ = *(undefined8 *)((long)rdata + lVar6 + -8);
      bVar2 = NotILikeOperator::Operation<duckdb::string_t,duckdb::string_t,bool>(str_01,pattern_01)
      ;
      result_data[iVar11] = bVar2;
      lVar6 = lVar6 + 0x10;
    }
  }
  else {
    uVar7 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
LAB_01863d1b:
        uVar9 = uVar7 << 4 | 8;
        for (; uVar3 = uVar7, uVar7 < uVar5; uVar7 = uVar7 + 1) {
          str.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar9);
          str.value._0_8_ = *(undefined8 *)((long)ldata + (uVar9 - 8));
          pattern.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar9);
          pattern.value._0_8_ = *(undefined8 *)((long)rdata + (uVar9 - 8));
          bVar2 = NotILikeOperator::Operation<duckdb::string_t,duckdb::string_t,bool>(str,pattern);
          result_data[uVar7] = bVar2;
          uVar9 = uVar9 + 0x10;
        }
      }
      else {
        uVar9 = puVar1[uVar4];
        uVar5 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar5 = count;
        }
        if (uVar9 == 0xffffffffffffffff) goto LAB_01863d1b;
        uVar3 = uVar5;
        if (uVar9 != 0) {
          uVar10 = uVar7 << 4 | 8;
          for (uVar8 = 0; uVar3 = uVar7 + uVar8, uVar7 + uVar8 < uVar5; uVar8 = uVar8 + 1) {
            if ((uVar9 >> (uVar8 & 0x3f) & 1) != 0) {
              str_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar10);
              str_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar10 - 8));
              pattern_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar10);
              pattern_00.value._0_8_ = *(undefined8 *)((long)rdata + (uVar10 - 8));
              bVar2 = NotILikeOperator::Operation<duckdb::string_t,duckdb::string_t,bool>
                                (str_00,pattern_00);
              result_data[uVar8 + uVar7] = bVar2;
            }
            uVar10 = uVar10 + 0x10;
          }
        }
      }
      uVar7 = uVar3;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}